

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_caseJump(sysbvm_bytecodeJit_t *jit,int16_t valueOperand,size_t caseCount,
                        int16_t *caseKeyOperands,int16_t *caseLabelOperands,
                        int16_t defaultLabelOperand,size_t pc)

{
  sysbvm_bytecodeJitPCRelocation_t relocation_00;
  size_t sVar1;
  sysbvm_bytecodeJitPCRelocation_t relocation;
  size_t relocationOffset;
  uint8_t instruction [8];
  size_t i;
  int16_t defaultLabelOperand_local;
  int16_t *caseLabelOperands_local;
  int16_t *caseKeyOperands_local;
  size_t caseCount_local;
  int16_t valueOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  instruction[0] = '\0';
  instruction[1] = '\0';
  instruction[2] = '\0';
  instruction[3] = '\0';
  instruction[4] = '\0';
  instruction[5] = '\0';
  instruction[6] = '\0';
  instruction[7] = '\0';
  for (; (ulong)instruction < caseCount; instruction = (uint8_t  [8])((long)instruction + 1)) {
    sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,valueOperand);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,caseKeyOperands[(long)instruction]);
    sysbvm_jit_x86_call(jit,sysbvm_tuple_equals);
    relocationOffset._0_1_ = 0x84;
    relocationOffset._1_1_ =
         sysbvm_jit_x86_modRMRegister
                   (SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_64_CALL_SHADOW_SPACE);
    relocationOffset._2_1_ = 0xf;
    relocationOffset._3_1_ = 0x85;
    relocationOffset._4_1_ = 0;
    relocationOffset._5_1_ = 0;
    relocationOffset._6_1_ = 0;
    relocationOffset._7_1_ = 0;
    sVar1 = sysbvm_bytecodeJit_addBytes(jit,8,(uint8_t *)&relocationOffset);
    relocation_00.targetPC = pc + (long)caseLabelOperands[(long)instruction];
    relocation_00.offset = sVar1 - 4;
    relocation_00.addend = -4;
    sysbvm_bytecodeJit_addPCRelocation(jit,relocation_00);
  }
  sysbvm_jit_jumpRelative(jit,pc + (long)defaultLabelOperand);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_caseJump(sysbvm_bytecodeJit_t *jit, int16_t valueOperand, size_t caseCount, int16_t *caseKeyOperands, int16_t *caseLabelOperands, int16_t defaultLabelOperand, size_t pc)
{
    for(size_t i = 0; i < caseCount; ++i)
    {
        sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, valueOperand);
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, caseKeyOperands[i]);
        sysbvm_jit_x86_call(jit, &sysbvm_tuple_equals);

        uint8_t instruction[] = {
            // test AL, AL
            0x84, sysbvm_jit_x86_modRMRegister(SYSBVM_X86_RAX, SYSBVM_X86_RAX),

            // jnz
            0x0F, 0x85, 0x00, 0x00, 0x00, 0x00,
        };

        size_t relocationOffset = sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction) - 4;
        sysbvm_bytecodeJitPCRelocation_t relocation = {
            .offset = relocationOffset,
            .targetPC = pc + caseLabelOperands[i],
            .addend = -4,
        };
        sysbvm_bytecodeJit_addPCRelocation(jit, relocation);
    }

    sysbvm_jit_jumpRelative(jit, pc + defaultLabelOperand);
}